

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionTaperedTimoshenkoFPM.cpp
# Opt level: O1

ChMatrixNM<double,_6,_6> * __thiscall
chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM::GetRlawAtPoint
          (ChMatrixNM<double,_6,_6> *__return_storage_ptr__,
          ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM *this,double eta)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  Index outer;
  double *pdVar30;
  undefined1 (*pauVar31) [16];
  Index col;
  long lVar32;
  long lVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  ulong uVar41;
  double dVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  ChMatrixNM<double,_6,_6> mb;
  DampingCoefficients rdamping_coeff_B;
  DampingCoefficients rdamping_coeff_A;
  ChMatrixNM<double,_6,_6> Klaw_point;
  double local_480 [40];
  double local_340 [4];
  undefined1 local_320 [16];
  double adStack_310 [6];
  double adStack_2e0 [6];
  double adStack_2b0 [6];
  double adStack_280 [6];
  double adStack_250 [12];
  double local_1f0;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  ulong local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  ChMatrixNM<double,_6,_6> local_1a0;
  
  (**(code **)(*(long *)(this->section_fpmA).
                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 0x150))(&local_1c8);
  (**(code **)(*(long *)(this->section_fpmB).
                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 0x150))(&local_1f0);
  uVar41 = (**(code **)(*(long *)(this->section_fpmA).
                                 super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + 0x1a8))();
  dVar42 = (double)(**(code **)(*(long *)(this->section_fpmB).
                                         super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + 0x1a8))();
  dVar10 = (eta + 1.0) * 0.5;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = local_1c8;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = local_1c0;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = local_1b8;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = local_1b0;
  pdVar30 = local_480;
  local_480[0x20] = 0.0;
  local_480[0x21] = 0.0;
  local_480[0x22] = 0.0;
  local_480[0x18] = 0.0;
  local_480[0x19] = 0.0;
  local_480[0x1a] = 0.0;
  local_480[0x1b] = 0.0;
  local_480[0x1d] = 0.0;
  local_480[0x1e] = 0.0;
  local_480[0x1f] = 0.0;
  local_480[0x10] = 0.0;
  local_480[0x11] = 0.0;
  local_480[0x12] = 0.0;
  local_480[0x13] = 0.0;
  local_480[0x14] = 0.0;
  local_480[0x16] = 0.0;
  local_480[0x17] = 0.0;
  local_480[8] = 0.0;
  local_480[9] = 0.0;
  local_480[10] = 0.0;
  local_480[0xb] = 0.0;
  local_480[0xc] = 0.0;
  local_480[0xd] = 0.0;
  local_480[0xf] = 0.0;
  local_480[1] = 0.0;
  local_480[2] = 0.0;
  local_480[3] = 0.0;
  local_480[4] = 0.0;
  local_480[5] = 0.0;
  local_480[6] = 0.0;
  lVar32 = 0;
  do {
    *pdVar30 = 1.0;
    lVar32 = lVar32 + 0x30;
    pdVar30 = pdVar30 + 7;
  } while (lVar32 != 0x120);
  dVar11 = (1.0 - eta) * 0.5;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar11;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar10 * local_1f0;
  auVar36 = vfmadd213sd_fma(auVar36,auVar39,auVar47);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar10 * local_1e8;
  auVar34 = vfmadd213sd_fma(auVar34,auVar39,auVar43);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar11;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar10 * local_1e0;
  auVar35 = vfmadd213sd_fma(auVar35,auVar40,auVar45);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar10 * local_1d8;
  auVar37 = vfmadd213sd_fma(auVar37,auVar40,auVar46);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar41;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar10 * dVar42;
  auVar12 = vfmadd213sd_fma(auVar44,auVar40,auVar38);
  local_480[0] = auVar36._0_8_;
  local_480[0x23] = auVar34._0_8_;
  local_480[7] = auVar12._0_8_ * local_480[0x23];
  local_480[0x1c] = auVar35._0_8_;
  local_480[0xe] = auVar12._0_8_ * local_480[0x1c];
  local_480[0x15] = auVar37._0_8_;
  GetKlawAtPoint(&local_1a0,this,eta);
  auVar12._8_8_ = local_480[1];
  auVar12._0_8_ = local_480[0];
  auVar13._8_8_ = local_480[3];
  auVar13._0_8_ = local_480[2];
  auVar14._8_8_ = local_480[5];
  auVar14._0_8_ = local_480[4];
  auVar15._8_8_ = local_480[7];
  auVar15._0_8_ = local_480[6];
  auVar18._8_8_ = local_480[0xd];
  auVar18._0_8_ = local_480[0xc];
  auVar21._8_8_ = local_480[0x13];
  auVar21._0_8_ = local_480[0x12];
  auVar24._8_8_ = local_480[0x19];
  auVar24._0_8_ = local_480[0x18];
  auVar27._8_8_ = local_480[0x1f];
  auVar27._0_8_ = local_480[0x1e];
  auVar16._8_8_ = local_480[9];
  auVar16._0_8_ = local_480[8];
  auVar19._8_8_ = local_480[0xf];
  auVar19._0_8_ = local_480[0xe];
  auVar22._8_8_ = local_480[0x15];
  auVar22._0_8_ = local_480[0x14];
  auVar25._8_8_ = local_480[0x1b];
  auVar25._0_8_ = local_480[0x1a];
  auVar28._8_8_ = local_480[0x21];
  auVar28._0_8_ = local_480[0x20];
  auVar17._8_8_ = local_480[0xb];
  auVar17._0_8_ = local_480[10];
  auVar20._8_8_ = local_480[0x11];
  auVar20._0_8_ = local_480[0x10];
  auVar23._8_8_ = local_480[0x17];
  auVar23._0_8_ = local_480[0x16];
  auVar26._8_8_ = local_480[0x1d];
  auVar26._0_8_ = local_480[0x1c];
  auVar29._8_8_ = local_480[0x23];
  auVar29._0_8_ = local_480[0x22];
  pauVar31 = &local_320;
  lVar32 = 0;
  do {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_1a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                   m_data.array[lVar32];
    auVar34 = vmovddup_avx512vl(auVar4);
    auVar35 = vmulpd_avx512vl(auVar12,auVar34);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_1a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                   m_data.array[lVar32 + 6];
    auVar36 = vmovddup_avx512vl(auVar5);
    auVar35 = vfmadd231pd_avx512vl(auVar35,auVar15,auVar36);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_1a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                   m_data.array[lVar32 + 0xc];
    auVar37 = vmovddup_avx512vl(auVar6);
    auVar35 = vfmadd231pd_avx512vl(auVar35,auVar18,auVar37);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_1a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                   m_data.array[lVar32 + 0x12];
    auVar38 = vmovddup_avx512vl(auVar7);
    auVar35 = vfmadd231pd_avx512vl(auVar35,auVar21,auVar38);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_1a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                   m_data.array[lVar32 + 0x18];
    auVar39 = vmovddup_avx512vl(auVar8);
    auVar35 = vfmadd231pd_avx512vl(auVar35,auVar24,auVar39);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_1a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                   m_data.array[lVar32 + 0x1e];
    auVar40 = vmovddup_avx512vl(auVar9);
    auVar35 = vfmadd231pd_avx512vl(auVar35,auVar27,auVar40);
    pauVar31[-2] = auVar35;
    auVar35 = vmulpd_avx512vl(auVar34,auVar13);
    auVar35 = vfmadd231pd_avx512vl(auVar35,auVar16,auVar36);
    auVar35 = vfmadd231pd_avx512vl(auVar35,auVar19,auVar37);
    auVar35 = vfmadd231pd_avx512vl(auVar35,auVar22,auVar38);
    auVar35 = vfmadd231pd_avx512vl(auVar35,auVar25,auVar39);
    auVar35 = vfmadd231pd_avx512vl(auVar35,auVar28,auVar40);
    pauVar31[-1] = auVar35;
    auVar34 = vmulpd_avx512vl(auVar34,auVar14);
    auVar34 = vfmadd231pd_avx512vl(auVar34,auVar17,auVar36);
    auVar34 = vfmadd231pd_avx512vl(auVar34,auVar20,auVar37);
    auVar34 = vfmadd231pd_avx512vl(auVar34,auVar23,auVar38);
    auVar34 = vfmadd231pd_avx512vl(auVar34,auVar26,auVar39);
    auVar34 = vfmadd231pd_avx512vl(auVar34,auVar29,auVar40);
    *pauVar31 = auVar34;
    lVar32 = lVar32 + 1;
    pauVar31 = pauVar31 + 3;
  } while (lVar32 != 6);
  lVar32 = 0;
  pdVar30 = (double *)__return_storage_ptr__;
  do {
    dVar10 = local_340[lVar32];
    dVar42 = adStack_310[lVar32];
    dVar11 = adStack_2e0[lVar32];
    dVar1 = adStack_2b0[lVar32];
    dVar2 = adStack_280[lVar32];
    dVar3 = adStack_250[lVar32];
    lVar33 = 0;
    do {
      pdVar30[lVar33] =
           dVar10 * local_480[lVar33] +
           dVar11 * local_480[lVar33 + 0xc] + dVar42 * local_480[lVar33 + 6] +
           dVar2 * local_480[lVar33 + 0x18] + dVar3 * local_480[lVar33 + 0x1e] +
           dVar1 * local_480[lVar33 + 0x12];
      lVar33 = lVar33 + 1;
    } while (lVar33 != 6);
    lVar32 = lVar32 + 1;
    pdVar30 = pdVar30 + 6;
  } while (lVar32 != 6);
  return __return_storage_ptr__;
}

Assistant:

ChMatrixNM<double, 6, 6> ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM::GetRlawAtPoint(const double eta) {
    DampingCoefficients rdamping_coeff_A = this->section_fpmA->GetBeamRaleyghDamping();
    DampingCoefficients rdamping_coeff_B = this->section_fpmB->GetBeamRaleyghDamping();
    double artificial_factor_for_shear_damping_A = this->section_fpmA->GetArtificialFactorForShearDamping();
    double artificial_factor_for_shear_damping_B = this->section_fpmB->GetArtificialFactorForShearDamping();

    // linear interpolation
    double Nx1 = (1. / 2.) * (1 - eta);
    double Nx2 = (1. / 2.) * (1 + eta);
    double mbx = Nx1 * rdamping_coeff_A.bx + Nx2 * rdamping_coeff_B.bx;
    double mby = Nx1 * rdamping_coeff_A.by + Nx2 * rdamping_coeff_B.by;
    double mbz = Nx1 * rdamping_coeff_A.bz + Nx2 * rdamping_coeff_B.bz;
    double mbt = Nx1 * rdamping_coeff_A.bt + Nx2 * rdamping_coeff_B.bt;
    double artificial_factor_for_shear_damping =
        Nx1 * artificial_factor_for_shear_damping_A + Nx2 * artificial_factor_for_shear_damping_B;

    ChMatrixNM<double, 6, 6> mb;
    mb.setIdentity();
    mb(0, 0) = mbx;
    mb(1, 1) = mby * artificial_factor_for_shear_damping;
    mb(2, 2) = mbz * artificial_factor_for_shear_damping;
    mb(3, 3) = mbt;
    mb(4, 4) = mbz;
    mb(5, 5) = mby;

    ChMatrixNM<double, 6, 6> Klaw_point = this->GetKlawAtPoint(eta);
    ChMatrixNM<double, 6, 6> Rlaw_point = mb.transpose() * Klaw_point * mb;  // material damping matrix

    return Rlaw_point;
}